

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DumpReader.cpp
# Opt level: O2

void __thiscall OpenMD::DumpReader::~DumpReader(DumpReader *this)

{
  std::_Vector_base<std::fpos<__mbstate_t>,_std::allocator<std::fpos<__mbstate_t>_>_>::~_Vector_base
            (&(this->framePos_).
              super__Vector_base<std::fpos<__mbstate_t>,_std::allocator<std::fpos<__mbstate_t>_>_>);
  std::ifstream::~ifstream(&this->inFile_);
  std::__cxx11::string::~string((string *)&this->filename_);
  return;
}

Assistant:

DumpReader::~DumpReader() {
#ifdef IS_MPI
    strcpy(checkPointMsg, "Dump file closed successfully.");
    errorCheckPoint();
#endif
  }